

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  undefined1 uVar1;
  bool bVar2;
  void *pvVar3;
  string *in_RDX;
  undefined8 *in_RDI;
  SparsityStructure *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  string *name_00;
  size_t in_stack_ffffffffffffffa8;
  LinearConstraintImplementation *in_stack_ffffffffffffffb0;
  string local_48 [2];
  
  name_00 = local_48;
  std::__cxx11::string::string((string *)name_00,in_RDX);
  Constraint::Constraint((Constraint *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,name_00);
  std::__cxx11::string::~string((string *)local_48);
  *in_RDI = &PTR__LinearConstraint_003fb0a0;
  pvVar3 = operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[0x13] = pvVar3;
  uVar1 = SparsityStructure::isValid
                    ((SparsityStructure *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  if ((bool)uVar1) {
    *(undefined1 *)(in_RDI[0x13] + 0x68) = 1;
    SparsityStructure::operator=
              ((SparsityStructure *)
               CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
               in_stack_ffffffffffffff68);
  }
  bVar2 = SparsityStructure::isValid
                    ((SparsityStructure *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  if (bVar2) {
    *(undefined1 *)(in_RDI[0x13] + 0x69) = 1;
    SparsityStructure::operator=
              ((SparsityStructure *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff70)),
               in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : Constraint(size, name)
            , m_pimpl(new LinearConstraintImplementation(size))
        {
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }